

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O0

Slice __thiscall leveldb::InternalKey::Encode(InternalKey *this)

{
  long lVar1;
  Slice SVar2;
  bool bVar3;
  Slice *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  char *local_18;
  size_t local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_ffffffffffffffc8);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!rep_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                  ,0x96,"Slice leveldb::InternalKey::Encode() const");
  }
  Slice::Slice(in_RDI,in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar2.size_ = local_10;
    SVar2.data_ = local_18;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice Encode() const {
    assert(!rep_.empty());
    return rep_;
  }